

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
          (PathTypeHandlerBase *this,Type *type,ObjectSlotAttributes *attributes,
          EquivalentPropertyEntry *entry)

{
  TypePath *this_00;
  bool bVar1;
  PropertyIndex slotIndex;
  PropertyIndex PVar2;
  ObjectSlotAttributes OVar3;
  
  slotIndex = TypePath::LookupInline
                        ((this->typePath).ptr,entry->propertyId,
                         (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
  if (slotIndex == 0xffff) {
    if ((entry->slotIndex != 0xffff) || (entry->mustBeWritable != false)) goto LAB_00c48552;
LAB_00c48546:
    bVar1 = true;
  }
  else {
    if (attributes == (ObjectSlotAttributes *)0x0) {
      OVar3 = ObjectSlotAttr_Default;
LAB_00c484e6:
      PVar2 = DynamicTypeHandler::AdjustValidSlotIndexForInlineSlots
                        (&this->super_DynamicTypeHandler,slotIndex);
      if (((PVar2 == entry->slotIndex) &&
          (entry->isAuxSlot == (this->super_DynamicTypeHandler).inlineSlotCapacity <= slotIndex)) &&
         ((entry->mustBeWritable != true ||
          (((OVar3 & ObjectSlotAttr_Writable) != ObjectSlotAttr_None &&
           ((DAT_0145c381 != '\x01' ||
            ((this_00 = (this->typePath).ptr,
             slotIndex < ((this_00->data).ptr)->maxInitializedLength &&
             (bVar1 = TypePath::GetIsFixedFieldAt
                                (this_00,slotIndex,
                                 (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1)), !bVar1)
             ))))))))) goto LAB_00c48546;
    }
    else {
      OVar3 = attributes[slotIndex];
      if ((OVar3 & ObjectSlotAttr_Deleted) == ObjectSlotAttr_None) {
        if ((OVar3 & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) goto LAB_00c484e6;
      }
      else if (entry->slotIndex == 0xffff) {
        return (bool)(entry->mustBeWritable ^ 1);
      }
    }
LAB_00c48552:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper(const Type* type, const ObjectSlotAttributes * attributes, const EquivalentPropertyEntry *entry)
    {
        Js::PropertyIndex absSlotIndex = GetTypePath()->LookupInline(entry->propertyId, GetPathLength());

        if (absSlotIndex != Constants::NoSlot)
        {
            ObjectSlotAttributes attr = attributes ? attributes[absSlotIndex] : ObjectSlotAttr_Default;

            if (attr & ObjectSlotAttr_Deleted)
            {
                return entry->slotIndex == Constants::NoSlot && !entry->mustBeWritable;
            }

            if (attr & ObjectSlotAttr_Accessor)
            {
                return false;
            }

            Js::PropertyIndex relSlotIndex = AdjustValidSlotIndexForInlineSlots(absSlotIndex);
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable)
            {
                if (!(attr & ObjectSlotAttr_Writable))
                {
                    return false;
                }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                int maxInitializedLength = this->GetTypePath()->GetMaxInitializedLength();
                if (FixPropsOnPathTypes() && (absSlotIndex >= maxInitializedLength || this->GetTypePath()->GetIsFixedFieldAt(absSlotIndex, this->GetPathLength())))
                {
                    return false;
                }
#endif
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }